

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

int __thiscall
QWaitConditionPrivate::wait_relative(QWaitConditionPrivate *this,QDeadlineTimer deadline)

{
  long lVar1;
  QDeadlineTimer deadline_00;
  int iVar2;
  undefined8 in_RSI;
  pthread_mutex_t *in_RDI;
  long in_FS_OFFSET;
  timespec tVar3;
  timespec ti;
  undefined1 *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  deadline_00._8_8_ = in_RSI;
  deadline_00.t1 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  tVar3 = deadlineToAbstime<1>(deadline_00);
  local_28 = (undefined1 *)tVar3.tv_sec;
  iVar2 = pthread_cond_timedwait((pthread_cond_t *)(in_RDI + 1),in_RDI,(timespec *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int wait_relative(QDeadlineTimer deadline)
    {
        timespec ti = deadlineToAbstime<QWaitConditionClockId>(deadline);
        return pthread_cond_timedwait(&cond, &mutex, &ti);
    }